

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asmcode.h
# Opt level: O3

void __thiscall
assembler::asmcode::
add<assembler::asmcode::operation,assembler::asmcode::operand&,assembler::asmcode::operand,unsigned_long&>
          (asmcode *this,operation *val,operand *val_1,operand *val_2,unsigned_long *val_3)

{
  instruction ins;
  instruction local_50;
  
  assembler::asmcode::instruction::instruction(&local_50,*val,*val_1,*val_2,*val_3);
  std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>::
  push_back((vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>
             *)(*(long *)(*(long *)(this + 0x20) + -8) + 0x10),&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.text._M_dataplus._M_p != &local_50.text.field_2) {
    operator_delete(local_50.text._M_dataplus._M_p,local_50.text.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void add(T&&... val)
      {
      instruction ins(std::forward<T>(val)...);
      (*instructions_list_stack.back()).push_back(ins);
      }